

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O2

bool __thiscall QPDFObject::getDescription(QPDFObject *this,QPDF **a_qpdf,string *description)

{
  string sStack_38;
  
  *a_qpdf = this->qpdf;
  getDescription_abi_cxx11_(&sStack_38,this);
  std::__cxx11::string::operator=((string *)description,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return this->qpdf != (QPDF *)0x0;
}

Assistant:

bool
    getDescription(QPDF*& a_qpdf, std::string& description)
    {
        a_qpdf = qpdf;
        description = getDescription();
        return qpdf != nullptr;
    }